

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O1

int duckdb::Linenoise::ParseOption(char **azArg,int nArg,char **out_error)

{
  char *__s1;
  int iVar1;
  int iVar2;
  char *pcVar3;
  HighlightingType HVar4;
  
  pcVar3 = *azArg;
  iVar1 = strcmp(pcVar3,"highlight");
  if (iVar1 == 0) {
    if (nArg == 2) {
      pcVar3 = azArg[1];
      iVar1 = strcmp(pcVar3,"off");
      if ((iVar1 == 0) || (iVar1 = strcmp(pcVar3,"0"), iVar1 == 0)) {
        Highlighting::Disable();
        return 1;
      }
      iVar1 = strcmp(pcVar3,"on");
      if ((iVar1 == 0) || (iVar1 = strcmp(pcVar3,"1"), iVar1 == 0)) {
        Highlighting::Enable();
        return 1;
      }
    }
    pcVar3 = "Expected usage: .highlight [off|on]";
  }
  else {
    iVar1 = strcmp(pcVar3,"render_errors");
    if (iVar1 == 0) {
      if (nArg == 2) {
        pcVar3 = azArg[1];
        iVar1 = strcmp(pcVar3,"off");
        if ((iVar1 == 0) || (iVar1 = strcmp(pcVar3,"0"), iVar1 == 0)) {
          DisableErrorRendering();
          return 1;
        }
        iVar1 = strcmp(pcVar3,"on");
        if ((iVar1 == 0) || (iVar1 = strcmp(pcVar3,"1"), iVar1 == 0)) {
          EnableErrorRendering();
          return 1;
        }
      }
      pcVar3 = "Expected usage: .render_errors [off|on]";
    }
    else {
      iVar1 = strcmp(pcVar3,"render_completion");
      if (iVar1 == 0) {
        if (nArg == 2) {
          pcVar3 = azArg[1];
          iVar1 = strcmp(pcVar3,"off");
          if ((iVar1 == 0) || (iVar1 = strcmp(pcVar3,"0"), iVar1 == 0)) {
            DisableCompletionRendering();
            return 1;
          }
          iVar1 = strcmp(pcVar3,"on");
          if ((iVar1 == 0) || (iVar1 = strcmp(pcVar3,"1"), iVar1 == 0)) {
            EnableCompletionRendering();
            return 1;
          }
        }
        pcVar3 = "Expected usage: .render_completion [off|on]";
      }
      else {
        iVar1 = strcmp(pcVar3,"keyword");
        if ((((iVar1 == 0) || (iVar1 = strcmp(pcVar3,"constant"), iVar1 == 0)) ||
            (iVar1 = strcmp(pcVar3,"comment"), iVar1 == 0)) ||
           (((iVar1 = strcmp(pcVar3,"error"), iVar1 == 0 ||
             (iVar1 = strcmp(pcVar3,"cont"), iVar1 == 0)) ||
            (iVar1 = strcmp(pcVar3,"cont_sel"), iVar1 == 0)))) {
          if ((nArg == 2) &&
             (pcVar3 = Highlighting::GetColorOption(azArg[1]), pcVar3 != (char *)0x0)) {
            __s1 = *azArg;
            iVar1 = strcmp(__s1,"keyword");
            if (iVar1 == 0) {
              HVar4 = KEYWORD;
            }
            else {
              iVar1 = strcmp(__s1,"constant");
              if (iVar1 == 0) {
                HVar4 = CONSTANT;
              }
              else {
                iVar1 = strcmp(__s1,"comment");
                if (iVar1 == 0) {
                  HVar4 = COMMENT;
                }
                else {
                  iVar1 = strcmp(__s1,"error");
                  if (iVar1 == 0) {
                    HVar4 = ERROR;
                  }
                  else {
                    iVar1 = strcmp(__s1,"cont");
                    HVar4 = CONTINUATION_SELECTED - (iVar1 == 0);
                  }
                }
              }
            }
            Highlighting::SetHighlightingColor(HVar4,pcVar3);
            if (pcVar3 != (char *)0x0) {
              return 1;
            }
          }
          pcVar3 = 
          "Expected usage: .[keyword|constant|comment|error|cont|cont_sel] [red|green|yellow|blue|magenta|cyan|white|brightblack|brightred|brightgreen|brightyellow|brightblue|brightmagenta|brightcyan|brightwhite]"
          ;
        }
        else {
          iVar1 = strcmp(pcVar3,"keywordcode");
          if (((((iVar1 != 0) && (iVar2 = strcmp(pcVar3,"constantcode"), iVar2 != 0)) &&
               (iVar2 = strcmp(pcVar3,"commentcode"), iVar2 != 0)) &&
              ((iVar2 = strcmp(pcVar3,"errorcode"), iVar2 != 0 &&
               (iVar2 = strcmp(pcVar3,"contcode"), iVar2 != 0)))) &&
             (iVar2 = strcmp(pcVar3,"cont_selcode"), iVar2 != 0)) {
            iVar1 = strcmp(pcVar3,"multiline");
            if (iVar1 == 0) {
              linenoiseSetMultiLine(1);
              return 1;
            }
            iVar1 = strcmp(pcVar3,"singleline");
            if (iVar1 == 0) {
              linenoiseSetMultiLine(0);
              return 1;
            }
            return 0;
          }
          if (nArg == 2) {
            if (iVar1 == 0) {
              HVar4 = KEYWORD;
            }
            else {
              iVar1 = strcmp(pcVar3,"constantcode");
              if (iVar1 == 0) {
                HVar4 = CONSTANT;
              }
              else {
                iVar1 = strcmp(pcVar3,"commentcode");
                if (iVar1 == 0) {
                  HVar4 = COMMENT;
                }
                else {
                  iVar1 = strcmp(pcVar3,"errorcode");
                  if (iVar1 == 0) {
                    HVar4 = ERROR;
                  }
                  else {
                    iVar1 = strcmp(pcVar3,"contcode");
                    HVar4 = CONTINUATION_SELECTED - (iVar1 == 0);
                  }
                }
              }
            }
            Highlighting::SetHighlightingColor(HVar4,azArg[1]);
            return 1;
          }
          pcVar3 = 
          "Expected usage: .[keywordcode|constantcode|commentcode|errorcode|contcode|cont_selcode] [terminal_code]"
          ;
        }
      }
    }
  }
  *out_error = pcVar3;
  return 1;
}

Assistant:

int Linenoise::ParseOption(const char **azArg, int nArg, const char **out_error) {
	if (strcmp(azArg[0], "highlight") == 0) {
		if (nArg == 2) {
			if (strcmp(azArg[1], "off") == 0 || strcmp(azArg[1], "0") == 0) {
				Highlighting::Disable();
				return 1;
			} else if (strcmp(azArg[1], "on") == 0 || strcmp(azArg[1], "1") == 0) {
				Highlighting::Enable();
				return 1;
			}
		}
		*out_error = "Expected usage: .highlight [off|on]";
		return 1;
	} else if (strcmp(azArg[0], "render_errors") == 0) {
		if (nArg == 2) {
			if (strcmp(azArg[1], "off") == 0 || strcmp(azArg[1], "0") == 0) {
				Linenoise::DisableErrorRendering();
				return 1;
			} else if (strcmp(azArg[1], "on") == 0 || strcmp(azArg[1], "1") == 0) {
				Linenoise::EnableErrorRendering();
				return 1;
			}
		}
		*out_error = "Expected usage: .render_errors [off|on]";
		return 1;
	} else if (strcmp(azArg[0], "render_completion") == 0) {
		if (nArg == 2) {
			if (strcmp(azArg[1], "off") == 0 || strcmp(azArg[1], "0") == 0) {
				Linenoise::DisableCompletionRendering();
				return 1;
			} else if (strcmp(azArg[1], "on") == 0 || strcmp(azArg[1], "1") == 0) {
				Linenoise::EnableCompletionRendering();
				return 1;
			}
		}
		*out_error = "Expected usage: .render_completion [off|on]";
		return 1;
	} else if (strcmp(azArg[0], "keyword") == 0 || strcmp(azArg[0], "constant") == 0 ||
	           strcmp(azArg[0], "comment") == 0 || strcmp(azArg[0], "error") == 0 || strcmp(azArg[0], "cont") == 0 ||
	           strcmp(azArg[0], "cont_sel") == 0) {
		if (nArg == 2) {
			const char *option = Highlighting::GetColorOption(azArg[1]);
			if (option) {
				HighlightingType type;
				if (strcmp(azArg[0], "keyword") == 0) {
					type = HighlightingType::KEYWORD;
				} else if (strcmp(azArg[0], "constant") == 0) {
					type = HighlightingType::CONSTANT;
				} else if (strcmp(azArg[0], "comment") == 0) {
					type = HighlightingType::COMMENT;
				} else if (strcmp(azArg[0], "error") == 0) {
					type = HighlightingType::ERROR;
				} else if (strcmp(azArg[0], "cont") == 0) {
					type = HighlightingType::CONTINUATION;
				} else {
					type = HighlightingType::CONTINUATION_SELECTED;
				}
				Highlighting::SetHighlightingColor(type, option);
				return 1;
			}
		}
		*out_error = "Expected usage: .[keyword|constant|comment|error|cont|cont_sel] "
		             "[red|green|yellow|blue|magenta|cyan|white|brightblack|brightred|brightgreen|brightyellow|"
		             "brightblue|brightmagenta|brightcyan|brightwhite]";
		return 1;
	} else if (strcmp(azArg[0], "keywordcode") == 0 || strcmp(azArg[0], "constantcode") == 0 ||
	           strcmp(azArg[0], "commentcode") == 0 || strcmp(azArg[0], "errorcode") == 0 ||
	           strcmp(azArg[0], "contcode") == 0 || strcmp(azArg[0], "cont_selcode") == 0) {
		if (nArg == 2) {
			HighlightingType type;
			if (strcmp(azArg[0], "keywordcode") == 0) {
				type = HighlightingType::KEYWORD;
			} else if (strcmp(azArg[0], "constantcode") == 0) {
				type = HighlightingType::CONSTANT;
			} else if (strcmp(azArg[0], "commentcode") == 0) {
				type = HighlightingType::COMMENT;
			} else if (strcmp(azArg[0], "errorcode") == 0) {
				type = HighlightingType::ERROR;
			} else if (strcmp(azArg[0], "contcode") == 0) {
				type = HighlightingType::CONTINUATION;
			} else {
				type = HighlightingType::CONTINUATION_SELECTED;
			}
			Highlighting::SetHighlightingColor(type, azArg[1]);
			return 1;
		}
		*out_error =
		    "Expected usage: .[keywordcode|constantcode|commentcode|errorcode|contcode|cont_selcode] [terminal_code]";
		return 1;
	} else if (strcmp(azArg[0], "multiline") == 0) {
		linenoiseSetMultiLine(1);
		return 1;
	} else if (strcmp(azArg[0], "singleline") == 0) {
		linenoiseSetMultiLine(0);
		return 1;
	}
	return 0;
}